

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall SQVM::NEG_OP(SQVM *this,SQObjectPtr *trg,SQObjectPtr *o)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  SQObjectValue SVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  SQChar *pSVar8;
  SQMetaMethod mm;
  SQObjectPtr closure;
  SQObjectPtr local_48;
  SQFloat local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  SVar2 = (o->super_SQObject)._type;
  if ((int)SVar2 < 0xa000020) {
    if (SVar2 == OT_INTEGER) {
      lVar5 = (o->super_SQObject)._unVal.nInteger;
      if (((trg->super_SQObject)._type & 0x8000000) != 0) {
        pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._vptr_SQRefCounted[2])();
        }
      }
      (trg->super_SQObject)._type = OT_INTEGER;
      (trg->super_SQObject)._unVal.nInteger = -lVar5;
    }
    else {
      if (SVar2 != OT_FLOAT) goto LAB_0012d11a;
      local_38 = -(o->super_SQObject)._unVal.fFloat;
      if (((trg->super_SQObject)._type & 0x8000000) != 0) {
        pSVar1 = &(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          uStack_34 = 0x80000000;
          uStack_30 = 0x80000000;
          uStack_2c = 0x80000000;
          (*(((trg->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._vptr_SQRefCounted[2])();
        }
      }
      (trg->super_SQObject)._type = OT_FLOAT;
      (trg->super_SQObject)._unVal.pTable = (SQTable *)0x0;
      (trg->super_SQObject)._unVal.fFloat = local_38;
    }
    bVar6 = true;
  }
  else {
    if ((((SVar2 == OT_TABLE) || (SVar2 == OT_USERDATA)) || (SVar2 == OT_INSTANCE)) &&
       (pSVar3 = (o->super_SQObject)._unVal.pTable,
       (pSVar3->super_SQDelegable)._delegate != (SQTable *)0x0)) {
      local_48.super_SQObject._type = OT_NULL;
      local_48.super_SQObject._unVal.pTable = (SQTable *)0x0;
      iVar7 = (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                _vptr_SQRefCounted[6])(pSVar3,this,4);
      if ((char)iVar7 != '\0') {
        Push(this,o);
        bVar6 = CallMetaMethod(this,&local_48,mm,1,&this->temp_reg);
        if (bVar6) {
          SVar2 = (trg->super_SQObject)._type;
          SVar4 = (trg->super_SQObject)._unVal;
          (trg->super_SQObject)._type = (this->temp_reg).super_SQObject._type;
          (trg->super_SQObject)._unVal = (this->temp_reg).super_SQObject._unVal;
          (this->temp_reg).super_SQObject._type = SVar2;
          (this->temp_reg).super_SQObject._unVal = SVar4;
        }
        SQObjectPtr::~SQObjectPtr(&local_48);
        return bVar6;
      }
      SQObjectPtr::~SQObjectPtr(&local_48);
    }
LAB_0012d11a:
    pSVar8 = GetTypeName(o);
    bVar6 = false;
    Raise_Error(this,"attempt to negate a %s",pSVar8);
  }
  return bVar6;
}

Assistant:

bool SQVM::NEG_OP(SQObjectPtr &trg,const SQObjectPtr &o)
{

    switch(type(o)) {
    case OT_INTEGER:
        trg = -_integer(o);
        return true;
    case OT_FLOAT:
        trg = -_float(o);
        return true;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_UNM, closure)) {
                Push(o);
                if(!CallMetaMethod(closure, MT_UNM, 1, temp_reg)) return false;
                _Swap(trg,temp_reg);
                return true;

            }
        }
    default:break; //shutup compiler
    }
    Raise_Error(_SC("attempt to negate a %s"), GetTypeName(o));
    return false;
}